

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O0

QLayoutItem * __thiscall QtMWidgets::ToolBarLayout::itemAt(ToolBarLayout *this,int index)

{
  qsizetype qVar1;
  const_reference ppQVar2;
  int index_local;
  ToolBarLayout *this_local;
  
  if ((index < 0) || (qVar1 = QList<QLayoutItem_*>::size(&this->buttons), qVar1 + 2 <= (long)index))
  {
    return (QLayoutItem *)0x0;
  }
  if (index == 0) {
    return (QLayoutItem *)this->left;
  }
  qVar1 = QList<QLayoutItem_*>::size(&this->buttons);
  if ((long)index == qVar1 + 1) {
    return (QLayoutItem *)this->right;
  }
  ppQVar2 = QList<QLayoutItem_*>::at(&this->buttons,(long)(index + -1));
  return *ppQVar2;
}

Assistant:

QLayoutItem *
ToolBarLayout::itemAt( int index ) const
{
	if( index >= 0 && index < buttons.size() + 2 )
	{
		if( index == 0 )
			return left;
		else if( index == buttons.size() + 1 )
			return right;
		else
			return buttons.at( index - 1 );
	}
	else
		return 0;
}